

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

char * loguru::get_verbosity_name(Verbosity verbosity)

{
  char *local_20;
  char *local_18;
  char *name;
  Verbosity verbosity_local;
  
  if (s_verbosity_to_name_callback == (code *)0x0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (char *)(*s_verbosity_to_name_callback)(verbosity);
  }
  local_18 = local_20;
  if (local_20 == (char *)0x0) {
    if (verbosity < -2) {
      local_18 = "FATL";
    }
    else if (verbosity == -2) {
      local_18 = "ERR";
    }
    else if (verbosity == -1) {
      local_18 = "WARN";
    }
    else if (verbosity == 0) {
      local_18 = "INFO";
    }
  }
  return local_18;
}

Assistant:

const char* get_verbosity_name(Verbosity verbosity)
	{
		auto name = s_verbosity_to_name_callback
				? (*s_verbosity_to_name_callback)(verbosity)
				: nullptr;

		// Use standard replacements if callback fails:
		if (!name)
		{
			if (verbosity <= Verbosity_FATAL) {
				name = "FATL";
			} else if (verbosity == Verbosity_ERROR) {
				name = "ERR";
			} else if (verbosity == Verbosity_WARNING) {
				name = "WARN";
			} else if (verbosity == Verbosity_INFO) {
				name = "INFO";
			}
		}

		return name;
	}